

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O3

void __thiscall
DifferentialEquation::setParameter(DifferentialEquation *this,string *name,string *value)

{
  int iVar1;
  double d;
  stringstream setting;
  undefined8 local_1a8;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(value->_M_dataplus)._M_p,value->_M_string_length);
    std::istream::_M_extract<double>((double *)local_1a0);
    (*(this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
      [0xf])(local_1a8,this);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        this->eqnMethodPtr = (offset_in_DifferentialEquation_to_subr)stepEulerIto;
        *(undefined8 *)&this->field_0x158 = 0;
      }
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        this->eqnMethodPtr = (offset_in_DifferentialEquation_to_subr)stepEulerStratonovich;
        *(undefined8 *)&this->field_0x158 = 0;
      }
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void DifferentialEquation::setParameter( const string& name, const string& value )
{
	stringstream setting;
	
	// first value
	if (name=="starting-value") {
		double d;
		setting << value;
		setting >> d;
		init(d);
	}
	
	// mode
	else if (name=="mode") {
		if (value=="ito")
			setIto();
		if (value=="stratonovitch")
			setStratonovich();
	}
}